

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_group.hpp
# Opt level: O2

void __thiscall
oqpi::
parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)0,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
::parallel_group(parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)0,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
                 *this,scheduler<concurrent_queue> *sc,string *name,task_priority priority,
                int32_t taskCount,int32_t maxSimultaneousTasks)

{
  task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)0,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
  ::task_group(&this->
                super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)0,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
               ,sc,name,priority);
  (this->
  super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)0,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
  ).super_task_group_base.super_task_base._vptr_task_base =
       (_func_int **)&PTR__parallel_group_00215bf0;
  (this->activeTasksCount_).super___atomic_base<unsigned_long>._M_i = 0;
  (this->tasks_).super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tasks_).super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tasks_).super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->maxSimultaneousTasks_ = maxSimultaneousTasks;
  (this->currentTaskIndex_).super___atomic_base<unsigned_long>._M_i = 1;
  std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::reserve
            (&this->tasks_,(long)taskCount);
  return;
}

Assistant:

parallel_group(_Scheduler &sc, const std::string &name, task_priority priority, int32_t taskCount = 0, int32_t maxSimultaneousTasks = 0)
            : task_group<_Scheduler, _TaskType, _GroupContext>(sc, name, priority)
            , activeTasksCount_(0)
            , maxSimultaneousTasks_(maxSimultaneousTasks)
            , currentTaskIndex_(1)
        {
            tasks_.reserve(taskCount);
        }